

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t pax_header(archive_read *a,tar *tar,archive_entry *entry,archive_string *in_as)

{
  char *key_00;
  wchar_t wVar1;
  bool bVar2;
  wchar_t local_90;
  char *local_88;
  char *attr;
  wchar_t err2;
  wchar_t err;
  archive_string_conv *sconv;
  archive_string *as;
  char *value;
  char *key;
  char *p;
  size_t value_length;
  size_t line_length;
  size_t l;
  size_t attr_length;
  archive_string *in_as_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  local_88 = in_as->s;
  l = in_as->length;
  tar->pax_hdrcharset_binary = 0;
  (tar->entry_gname).length = 0;
  (tar->entry_linkpath).length = 0;
  (tar->entry_pathname).length = 0;
  (tar->entry_pathname_override).length = 0;
  (tar->entry_uname).length = 0;
  attr._4_4_ = L'\0';
  do {
    if (l == 0) {
      if (tar->pax_hdrcharset_binary == 0) {
        _err2 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
        if (_err2 == (archive_string_conv *)0x0) {
          return L'\xffffffe2';
        }
        if (tar->compat_2x != 0) {
          archive_string_conversion_set_opt(_err2,L'\x01');
        }
      }
      else {
        _err2 = tar->opt_sconv;
      }
      if (((tar->entry_gname).length != 0) &&
         (wVar1 = _archive_entry_copy_gname_l
                            (entry,(tar->entry_gname).s,(tar->entry_gname).length,_err2),
         wVar1 != L'\0')) {
        attr._4_4_ = set_conversion_failed_error(a,_err2,"Gname");
        if (attr._4_4_ == L'\xffffffe2') {
          return L'\xffffffe2';
        }
        archive_entry_copy_gname(entry,(tar->entry_gname).s);
      }
      if (((tar->entry_linkpath).length != 0) &&
         (wVar1 = _archive_entry_copy_link_l
                            (entry,(tar->entry_linkpath).s,(tar->entry_linkpath).length,_err2),
         wVar1 != L'\0')) {
        attr._4_4_ = set_conversion_failed_error(a,_err2,"Linkname");
        if (attr._4_4_ == L'\xffffffe2') {
          return L'\xffffffe2';
        }
        archive_entry_copy_link(entry,(tar->entry_linkpath).s);
      }
      sconv = (archive_string_conv *)0x0;
      if ((tar->entry_pathname_override).length == 0) {
        if ((tar->entry_pathname).length != 0) {
          sconv = (archive_string_conv *)&tar->entry_pathname;
        }
      }
      else {
        sconv = (archive_string_conv *)&tar->entry_pathname_override;
      }
      if ((sconv != (archive_string_conv *)0x0) &&
         (wVar1 = _archive_entry_copy_pathname_l
                            (entry,(char *)sconv->next,(size_t)sconv->from_charset,_err2),
         wVar1 != L'\0')) {
        attr._4_4_ = set_conversion_failed_error(a,_err2,"Pathname");
        if (attr._4_4_ == L'\xffffffe2') {
          return L'\xffffffe2';
        }
        archive_entry_copy_pathname(entry,(char *)sconv->next);
      }
      if (((tar->entry_uname).length != 0) &&
         (wVar1 = _archive_entry_copy_uname_l
                            (entry,(tar->entry_uname).s,(tar->entry_uname).length,_err2),
         wVar1 != L'\0')) {
        attr._4_4_ = set_conversion_failed_error(a,_err2,"Uname");
        if (attr._4_4_ == L'\xffffffe2') {
          return L'\xffffffe2';
        }
        archive_entry_copy_uname(entry,(tar->entry_uname).s);
      }
      return attr._4_4_;
    }
    value_length = 0;
    key = local_88;
    for (line_length = l; line_length != 0; line_length = line_length - 1) {
      if (*key == ' ') {
        key = key + 1;
        break;
      }
      if ((*key < '0') || ('9' < *key)) {
        archive_set_error(&a->archive,-1,"Ignoring malformed pax extended attributes");
        return L'\xffffffec';
      }
      value_length = (long)(*key + -0x30) + value_length * 10;
      if (999999 < value_length) {
        archive_set_error(&a->archive,-1,"Rejecting pax extended attribute > 1MB");
        return L'\xffffffec';
      }
      key = key + 1;
    }
    key_00 = key;
    if (((l < value_length) || (value_length == 0)) || (local_88[value_length - 1] != '\n')) {
      archive_set_error(&a->archive,-1,"Ignoring malformed pax extended attribute");
      return L'\xffffffec';
    }
    local_88[value_length - 1] = '\0';
    if (*key == '=') {
      return L'\xffffffff';
    }
    while( true ) {
      bVar2 = false;
      if (*key != '\0') {
        bVar2 = *key != '=';
      }
      if (!bVar2) break;
      key = key + 1;
    }
    if (*key == '\0') {
      archive_set_error(&a->archive,-1,"Invalid pax extended attributes");
      return L'\xffffffec';
    }
    *key = '\0';
    local_90 = pax_attribute(a,tar,entry,key_00,key + 1,
                             (size_t)(local_88 + ((value_length - 1) - (long)(key + 1))));
    if (local_90 == L'\xffffffe2') {
      return L'\xffffffe2';
    }
    if (attr._4_4_ < local_90) {
      local_90 = attr._4_4_;
    }
    attr._4_4_ = local_90;
    local_88 = local_88 + value_length;
    l = l - value_length;
  } while( true );
}

Assistant:

static int
pax_header(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, struct archive_string *in_as)
{
	size_t attr_length, l, line_length, value_length;
	char *p;
	char *key, *value;
	struct archive_string *as;
	struct archive_string_conv *sconv;
	int err, err2;
	char *attr = in_as->s;

	attr_length = in_as->length;
	tar->pax_hdrcharset_binary = 0;
	archive_string_empty(&(tar->entry_gname));
	archive_string_empty(&(tar->entry_linkpath));
	archive_string_empty(&(tar->entry_pathname));
	archive_string_empty(&(tar->entry_pathname_override));
	archive_string_empty(&(tar->entry_uname));
	err = ARCHIVE_OK;
	while (attr_length > 0) {
		/* Parse decimal length field at start of line. */
		line_length = 0;
		l = attr_length;
		p = attr; /* Record start of line. */
		while (l>0) {
			if (*p == ' ') {
				p++;
				l--;
				break;
			}
			if (*p < '0' || *p > '9') {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
				    "Ignoring malformed pax extended attributes");
				return (ARCHIVE_WARN);
			}
			line_length *= 10;
			line_length += *p - '0';
			if (line_length > 999999) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
				    "Rejecting pax extended attribute > 1MB");
				return (ARCHIVE_WARN);
			}
			p++;
			l--;
		}

		/*
		 * Parsed length must be no bigger than available data,
		 * at least 1, and the last character of the line must
		 * be '\n'.
		 */
		if (line_length > attr_length
		    || line_length < 1
		    || attr[line_length - 1] != '\n')
		{
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Ignoring malformed pax extended attribute");
			return (ARCHIVE_WARN);
		}

		/* Null-terminate the line. */
		attr[line_length - 1] = '\0';

		/* Find end of key and null terminate it. */
		key = p;
		if (key[0] == '=')
			return (-1);
		while (*p && *p != '=')
			++p;
		if (*p == '\0') {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid pax extended attributes");
			return (ARCHIVE_WARN);
		}
		*p = '\0';

		value = p + 1;

		/* Some values may be binary data */
		value_length = attr + line_length - 1 - value;

		/* Identify this attribute and set it in the entry. */
		err2 = pax_attribute(a, tar, entry, key, value, value_length);
		if (err2 == ARCHIVE_FATAL)
			return (err2);
		err = err_combine(err, err2);

		/* Skip to next line */
		attr += line_length;
		attr_length -= line_length;
	}

	/*
	 * PAX format uses UTF-8 as default charset for its metadata
	 * unless hdrcharset=BINARY is present in its header.
	 * We apply the charset specified by the hdrcharset option only
	 * when the hdrcharset attribute(in PAX header) is BINARY because
	 * we respect the charset described in PAX header and BINARY also
	 * means that metadata(filename,uname and gname) character-set
	 * is unknown.
	 */
	if (tar->pax_hdrcharset_binary)
		sconv = tar->opt_sconv;
	else {
		sconv = archive_string_conversion_from_charset(
		    &(a->archive), "UTF-8", 1);
		if (sconv == NULL)
			return (ARCHIVE_FATAL);
		if (tar->compat_2x)
			archive_string_conversion_set_opt(sconv,
			    SCONV_SET_OPT_UTF8_LIBARCHIVE2X);
	}

	if (archive_strlen(&(tar->entry_gname)) > 0) {
		if (archive_entry_copy_gname_l(entry, tar->entry_gname.s,
		    archive_strlen(&(tar->entry_gname)), sconv) != 0) {
			err = set_conversion_failed_error(a, sconv, "Gname");
			if (err == ARCHIVE_FATAL)
				return (err);
			/* Use a converted an original name. */
			archive_entry_copy_gname(entry, tar->entry_gname.s);
		}
	}
	if (archive_strlen(&(tar->entry_linkpath)) > 0) {
		if (archive_entry_copy_link_l(entry, tar->entry_linkpath.s,
		    archive_strlen(&(tar->entry_linkpath)), sconv) != 0) {
			err = set_conversion_failed_error(a, sconv, "Linkname");
			if (err == ARCHIVE_FATAL)
				return (err);
			/* Use a converted an original name. */
			archive_entry_copy_link(entry, tar->entry_linkpath.s);
		}
	}
	/*
	 * Some extensions (such as the GNU sparse file extensions)
	 * deliberately store a synthetic name under the regular 'path'
	 * attribute and the real file name under a different attribute.
	 * Since we're supposed to not care about the order, we
	 * have no choice but to store all of the various filenames
	 * we find and figure it all out afterwards.  This is the
	 * figuring out part.
	 */
	as = NULL;
	if (archive_strlen(&(tar->entry_pathname_override)) > 0)
		as = &(tar->entry_pathname_override);
	else if (archive_strlen(&(tar->entry_pathname)) > 0)
		as = &(tar->entry_pathname);
	if (as != NULL) {
		if (archive_entry_copy_pathname_l(entry, as->s,
		    archive_strlen(as), sconv) != 0) {
			err = set_conversion_failed_error(a, sconv, "Pathname");
			if (err == ARCHIVE_FATAL)
				return (err);
			/* Use a converted an original name. */
			archive_entry_copy_pathname(entry, as->s);
		}
	}
	if (archive_strlen(&(tar->entry_uname)) > 0) {
		if (archive_entry_copy_uname_l(entry, tar->entry_uname.s,
		    archive_strlen(&(tar->entry_uname)), sconv) != 0) {
			err = set_conversion_failed_error(a, sconv, "Uname");
			if (err == ARCHIVE_FATAL)
				return (err);
			/* Use a converted an original name. */
			archive_entry_copy_uname(entry, tar->entry_uname.s);
		}
	}
	return (err);
}